

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optim_mir.cpp
# Opt level: O0

map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *
find_idom(map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
          *nodes)

{
  const_iterator __first;
  bool bVar1;
  undefined1 uVar2;
  BasicBlock *pBVar3;
  ulong uVar4;
  size_type sVar5;
  pointer ppVar6;
  pointer ppVar7;
  size_type sVar8;
  mapped_type *this;
  vector<int,_std::allocator<int>_> *v2_00;
  reference ppBVar9;
  pointer ppVar10;
  reference __y;
  ostream *poVar11;
  pointer ppVar12;
  void *this_00;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *in_RDI;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_bool>
  pVar13;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_int>_>,_bool> pVar14;
  iterator i;
  int i_5;
  vector<int,_std::allocator<int>_> v2_1;
  vector<int,_std::allocator<int>_> v1_2;
  iterator itt_1;
  BasicBlock *prep;
  int i_4;
  BasicBlock *p;
  iterator itt;
  int i_3;
  vector<int,_std::allocator<int>_> v2;
  vector<int,_std::allocator<int>_> v1;
  queue<int,_std::deque<int,_std::allocator<int>_>_> q;
  vector<int,_std::allocator<int>_> visit;
  int j;
  vector<int,_std::allocator<int>_> v1_1;
  vector<int,_std::allocator<int>_> temp;
  int i_2;
  iterator iter;
  bool flag;
  vector<int,_std::allocator<int>_> pre;
  int i_1;
  vector<int,_std::allocator<int>_> N;
  iterator it;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  dom;
  BasicBlock *exit;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *dom1;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *in_stack_fffffffffffff918;
  pair<const_int,_std::vector<int,_std::allocator<int>_>_> *in_stack_fffffffffffff920;
  value_type *in_stack_fffffffffffff928;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffff930;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffff938;
  const_iterator in_stack_fffffffffffff940;
  undefined7 in_stack_fffffffffffff948;
  undefined1 in_stack_fffffffffffff94f;
  key_type *in_stack_fffffffffffff958;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  *in_stack_fffffffffffff960;
  mapped_type *in_stack_fffffffffffff968;
  iterator in_stack_fffffffffffff970;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffff9b0;
  undefined7 in_stack_fffffffffffff9b8;
  undefined1 in_stack_fffffffffffff9bf;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffff9c0;
  _Self local_550;
  _Base_ptr local_548;
  _Rb_tree_iterator<std::pair<const_int,_int>_> local_540;
  _Base_ptr local_538;
  _Base_ptr local_530;
  undefined1 local_528;
  pair<const_int,_int> local_520;
  _Self local_518;
  _Base_ptr local_510;
  undefined1 local_501;
  _Base_ptr local_470;
  int local_464;
  _Base_ptr local_448;
  vector<int,_std::allocator<int>_> local_440;
  _Base_ptr local_428;
  int *local_420;
  int *local_418;
  int *local_410;
  int *local_408;
  value_type local_400;
  int local_3f4;
  BasicBlock *local_3f0;
  _Base_ptr local_3e8;
  _Base_ptr local_350;
  int local_344;
  _Base_ptr local_328;
  vector<int,_std::allocator<int>_> local_320;
  _Base_ptr local_308;
  _Base_ptr local_298;
  int *local_290;
  int *local_288;
  int *local_278;
  int *local_270;
  int *local_268;
  _Self local_258;
  _Base_ptr local_250;
  _Base_ptr local_248;
  _Base_ptr local_1b0;
  int local_1a4;
  _Base_ptr local_188;
  vector<int,_std::allocator<int>_> local_180;
  _Base_ptr local_168;
  int local_15c;
  _Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_> local_158;
  byte local_149;
  _Base_ptr local_148;
  _Base_ptr local_140;
  undefined1 local_138;
  _Base_ptr local_110;
  undefined1 local_108;
  _Self local_c8;
  _Base_ptr local_c0;
  undefined4 local_b4;
  undefined4 local_b0;
  int local_ac;
  vector<int,_std::allocator<int>_> local_a8;
  _Rb_tree_iterator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_> local_90 [15];
  BasicBlock *local_18;
  
  std::
  map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
  ::map((map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
         *)in_stack_fffffffffffff920,
        (map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
         *)in_stack_fffffffffffff918);
  pBVar3 = find_exit((map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
                      *)in_stack_fffffffffffff920);
  std::
  map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
  ::~map((map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
          *)0x27e54b);
  local_18 = pBVar3;
  std::
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::map((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
         *)0x27e568);
  std::_Rb_tree_iterator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>::_Rb_tree_iterator
            (local_90);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x27e582);
  for (local_ac = 0; uVar4 = (ulong)local_ac,
      sVar5 = std::vector<int,_std::allocator<int>_>::size(&order), uVar4 < sVar5;
      local_ac = local_ac + 1) {
    std::vector<int,_std::allocator<int>_>::operator[](&order,(long)local_ac);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff930._M_current,
               &in_stack_fffffffffffff928->first);
  }
  local_b0 = 0xfffffffe;
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff920,
             (value_type_conflict3 *)in_stack_fffffffffffff918);
  local_b4 = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff920,
             (value_type_conflict3 *)in_stack_fffffffffffff918);
  local_c0 = (_Base_ptr)
             std::
             map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
             ::begin((map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
                      *)in_stack_fffffffffffff918);
  local_90[0]._M_node = local_c0;
  while( true ) {
    local_c8._M_node =
         (_Base_ptr)
         std::
         map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
         ::end((map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
                *)in_stack_fffffffffffff918);
    bVar1 = std::operator!=(local_90,&local_c8);
    if (!bVar1) break;
    ppVar6 = std::_Rb_tree_iterator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>::
             operator->((_Rb_tree_iterator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_> *)
                        0x27e6dc);
    if (ppVar6->first == -1) {
      std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x27e6fa);
      std::_Rb_tree_iterator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>::operator->
                ((_Rb_tree_iterator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_> *)
                 0x27e707);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff930._M_current,
                 &in_stack_fffffffffffff928->first);
      std::_Rb_tree_iterator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>::operator->
                ((_Rb_tree_iterator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_> *)
                 0x27e726);
      std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>::
      pair<std::vector<int,_std::allocator<int>_>_&,_true>
                (in_stack_fffffffffffff920,(int *)in_stack_fffffffffffff918,
                 (vector<int,_std::allocator<int>_> *)0x27e73e);
      pVar13 = std::
               map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
               ::insert((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                         *)in_stack_fffffffffffff930._M_current,in_stack_fffffffffffff928);
      local_110 = (_Base_ptr)pVar13.first._M_node;
      local_108 = pVar13.second;
      std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>::~pair
                ((pair<const_int,_std::vector<int,_std::allocator<int>_>_> *)0x27e791);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff930._M_current);
    }
    else {
      std::_Rb_tree_iterator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>::operator->
                ((_Rb_tree_iterator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_> *)
                 0x27e7f9);
      std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>::
      pair<std::vector<int,_std::allocator<int>_>_&,_true>
                (in_stack_fffffffffffff920,(int *)in_stack_fffffffffffff918,
                 (vector<int,_std::allocator<int>_> *)0x27e811);
      pVar13 = std::
               map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
               ::insert((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                         *)in_stack_fffffffffffff930._M_current,in_stack_fffffffffffff928);
      local_140 = (_Base_ptr)pVar13.first._M_node;
      local_138 = pVar13.second;
      std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>::~pair
                ((pair<const_int,_std::vector<int,_std::allocator<int>_>_> *)0x27e864);
    }
    local_148 = (_Base_ptr)
                std::_Rb_tree_iterator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>::
                operator++((_Rb_tree_iterator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>
                            *)in_stack_fffffffffffff928,
                           (int)((ulong)in_stack_fffffffffffff920 >> 0x20));
  }
  local_149 = 1;
  std::_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>::
  _Rb_tree_iterator(&local_158);
  while ((local_149 & 1) != 0) {
    local_149 = 0;
    for (local_15c = 0; uVar4 = (ulong)local_15c,
        sVar5 = std::vector<int,_std::allocator<int>_>::size(&local_a8), uVar4 < sVar5;
        local_15c = local_15c + 1) {
      std::vector<int,_std::allocator<int>_>::operator[](&local_a8,(long)local_15c);
      local_168 = (_Base_ptr)
                  std::
                  map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
                  ::find((map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
                          *)in_stack_fffffffffffff918,(key_type *)0x27e936);
      local_90[0]._M_node = local_168;
      std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x27e975);
      std::vector<int,_std::allocator<int>_>::operator[](&local_a8,(long)local_15c);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff930._M_current,
                 &in_stack_fffffffffffff928->first);
      ppVar6 = std::_Rb_tree_iterator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>::
               operator->((_Rb_tree_iterator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>
                           *)0x27e9a9);
      sVar5 = std::
              vector<front::optim_mir::BasicBlock_*,_std::allocator<front::optim_mir::BasicBlock_*>_>
              ::size(&ppVar6->second->preBlock);
      if (sVar5 != 0) {
        ppVar6 = std::_Rb_tree_iterator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>::
                 operator->((_Rb_tree_iterator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>
                             *)0x27e9cd);
        std::vector<front::optim_mir::BasicBlock_*,_std::allocator<front::optim_mir::BasicBlock_*>_>
        ::operator[](&ppVar6->second->preBlock,0);
        local_188 = (_Base_ptr)
                    std::
                    map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                    ::find((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                            *)in_stack_fffffffffffff918,(key_type *)0x27e9ee);
        local_158._M_node = local_188;
        std::_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>::
        operator->((_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                    *)0x27ea25);
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff970._M_node,
                   in_stack_fffffffffffff968);
        local_1a4 = 1;
        while( true ) {
          uVar4 = (ulong)local_1a4;
          ppVar6 = std::_Rb_tree_iterator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>::
                   operator->((_Rb_tree_iterator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>
                               *)0x27ea63);
          sVar5 = std::
                  vector<front::optim_mir::BasicBlock_*,_std::allocator<front::optim_mir::BasicBlock_*>_>
                  ::size(&ppVar6->second->preBlock);
          if (sVar5 <= uVar4) break;
          ppVar6 = std::_Rb_tree_iterator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>::
                   operator->((_Rb_tree_iterator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>
                               *)0x27ea91);
          std::
          vector<front::optim_mir::BasicBlock_*,_std::allocator<front::optim_mir::BasicBlock_*>_>::
          operator[](&ppVar6->second->preBlock,(long)local_1a4);
          local_1b0 = (_Base_ptr)
                      std::
                      map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                      ::find((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                              *)in_stack_fffffffffffff918,(key_type *)0x27eab6);
          local_158._M_node = local_1b0;
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff970._M_node,
                     in_stack_fffffffffffff968);
          std::_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>::
          operator->((_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                      *)0x27eb04);
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff970._M_node,
                     in_stack_fffffffffffff968);
          vectors_intersection
                    ((vector<int,_std::allocator<int>_> *)
                     CONCAT17(in_stack_fffffffffffff9bf,in_stack_fffffffffffff9b8),
                     in_stack_fffffffffffff9b0);
          std::vector<int,_std::allocator<int>_>::operator=
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff930._M_current,
                     (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff928);
          std::vector<int,_std::allocator<int>_>::~vector
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff930._M_current);
          std::vector<int,_std::allocator<int>_>::~vector
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff930._M_current);
          std::vector<int,_std::allocator<int>_>::~vector
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff930._M_current);
          local_1a4 = local_1a4 + 1;
        }
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff970._M_node,
                   in_stack_fffffffffffff968);
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff970._M_node,
                   in_stack_fffffffffffff968);
        vectors_set_union((vector<int,_std::allocator<int>_> *)
                          CONCAT17(in_stack_fffffffffffff9bf,in_stack_fffffffffffff9b8),
                          in_stack_fffffffffffff9b0);
        std::vector<int,_std::allocator<int>_>::operator=
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff930._M_current,
                   (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff928);
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff930._M_current);
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff930._M_current);
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff930._M_current);
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff930._M_current);
      }
      std::vector<int,_std::allocator<int>_>::operator[](&local_a8,(long)local_15c);
      local_248 = (_Base_ptr)
                  std::
                  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                  ::find((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                          *)in_stack_fffffffffffff918,(key_type *)0x27ed19);
      local_158._M_node = local_248;
      ppVar7 = std::
               _Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>::
               operator->((_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                           *)0x27ed50);
      sVar5 = std::vector<int,_std::allocator<int>_>::size(&ppVar7->second);
      sVar8 = std::vector<int,_std::allocator<int>_>::size(&local_180);
      if (sVar5 != sVar8) {
        std::vector<int,_std::allocator<int>_>::operator[](&local_a8,(long)local_15c);
        std::
        map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
        ::operator[](in_stack_fffffffffffff960,in_stack_fffffffffffff958);
        std::vector<int,_std::allocator<int>_>::operator=
                  (in_stack_fffffffffffff9c0,
                   (vector<int,_std::allocator<int>_> *)
                   CONCAT17(in_stack_fffffffffffff9bf,in_stack_fffffffffffff9b8));
        local_149 = 1;
      }
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff930._M_current);
    }
  }
  local_250 = (_Base_ptr)
              std::
              map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
              ::begin((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                       *)in_stack_fffffffffffff918);
  local_158._M_node = local_250;
  while( true ) {
    local_258._M_node =
         (_Base_ptr)
         std::
         map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
         ::end((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                *)in_stack_fffffffffffff918);
    bVar1 = std::operator!=(&local_158,&local_258);
    if (!bVar1) break;
    std::_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>::
    operator->((_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_> *)
               0x27ee76);
    std::_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>::
    operator->((_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_> *)
               0x27ee8f);
    local_270 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                 ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff918);
    std::_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>::
    operator->((_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_> *)
               0x27eeb0);
    local_278 = (int *)std::vector<int,_std::allocator<int>_>::end
                                 ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff918);
    std::_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>::
    operator->((_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_> *)
               0x27eed1);
    local_268 = (int *)std::
                       remove<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
                                 (in_stack_fffffffffffff938,in_stack_fffffffffffff930,
                                  &in_stack_fffffffffffff928->first);
    __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
    __normal_iterator<int*>
              ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
               in_stack_fffffffffffff920,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
               in_stack_fffffffffffff918);
    std::_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>::
    operator->((_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_> *)
               0x27ef25);
    local_288 = (int *)std::vector<int,_std::allocator<int>_>::end
                                 ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff918);
    __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
    __normal_iterator<int*>
              ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
               in_stack_fffffffffffff920,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
               in_stack_fffffffffffff918);
    __first._M_current._7_1_ = in_stack_fffffffffffff94f;
    __first._M_current._0_7_ = in_stack_fffffffffffff948;
    local_290 = (int *)std::vector<int,_std::allocator<int>_>::erase
                                 (in_stack_fffffffffffff938._M_current,__first,
                                  in_stack_fffffffffffff940);
    local_298 = (_Base_ptr)
                std::
                _Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>::
                operator++((_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                            *)in_stack_fffffffffffff928,
                           (int)((ulong)in_stack_fffffffffffff920 >> 0x20));
  }
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x27efae);
  std::queue<int,std::deque<int,std::allocator<int>>>::
  queue<std::deque<int,std::allocator<int>>,void>
            ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)in_stack_fffffffffffff920);
  local_308 = (_Base_ptr)
              std::
              map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
              ::find((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                      *)in_stack_fffffffffffff918,(key_type *)0x27efd2);
  local_158._M_node = local_308;
  std::_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>::operator->
            ((_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_> *)
             0x27f009);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff970._M_node,
             in_stack_fffffffffffff968);
  sVar5 = std::vector<int,_std::allocator<int>_>::size(&local_320);
  if (sVar5 != 0) {
    std::vector<int,_std::allocator<int>_>::operator[](&local_320,0);
    local_328 = (_Base_ptr)
                std::
                map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                ::find((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                        *)in_stack_fffffffffffff918,(key_type *)0x27f057);
    local_158._M_node = local_328;
    std::_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>::
    operator->((_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_> *)
               0x27f08e);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff970._M_node,
               in_stack_fffffffffffff968);
    for (local_344 = 1; uVar4 = (ulong)local_344,
        sVar5 = std::vector<int,_std::allocator<int>_>::size(&local_320), uVar4 < sVar5;
        local_344 = local_344 + 1) {
      std::vector<int,_std::allocator<int>_>::operator[](&local_320,(long)local_344);
      local_350 = (_Base_ptr)
                  std::
                  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                  ::find((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                          *)in_stack_fffffffffffff918,(key_type *)0x27f105);
      local_158._M_node = local_350;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff970._M_node,
                 in_stack_fffffffffffff968);
      std::_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>::
      operator->((_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                  *)0x27f153);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff970._M_node,
                 in_stack_fffffffffffff968);
      vectors_set_union((vector<int,_std::allocator<int>_> *)
                        CONCAT17(in_stack_fffffffffffff9bf,in_stack_fffffffffffff9b8),
                        in_stack_fffffffffffff9b0);
      std::vector<int,_std::allocator<int>_>::operator=
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff930._M_current,
                 (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff928);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff930._M_current);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff930._M_current);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff930._M_current);
    }
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff970._M_node,
               in_stack_fffffffffffff968);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff970._M_node,
               in_stack_fffffffffffff968);
    vectors_difference((vector<int,_std::allocator<int>_> *)
                       CONCAT17(in_stack_fffffffffffff9bf,in_stack_fffffffffffff9b8),
                       in_stack_fffffffffffff9b0);
    std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff930._M_current,
               (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff928);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff930._M_current);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff930._M_current);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff930._M_current);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff930._M_current);
  }
  this = std::
         map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
         ::operator[](in_stack_fffffffffffff960,in_stack_fffffffffffff958);
  std::vector<int,_std::allocator<int>_>::operator=
            (this,(vector<int,_std::allocator<int>_> *)
                  CONCAT17(in_stack_fffffffffffff9bf,in_stack_fffffffffffff9b8));
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff930._M_current,
             &in_stack_fffffffffffff928->first);
  std::queue<int,_std::deque<int,_std::allocator<int>_>_>::push
            ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)in_stack_fffffffffffff920,
             (value_type *)in_stack_fffffffffffff918);
  while (uVar2 = std::queue<int,_std::deque<int,_std::allocator<int>_>_>::empty
                           ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)0x27f3e8),
        ((uVar2 ^ 0xff) & 1) != 0) {
    v2_00 = (vector<int,_std::allocator<int>_> *)
            std::queue<int,_std::deque<int,_std::allocator<int>_>_>::front
                      ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)0x27f410);
    local_3e8 = (_Base_ptr)
                std::
                map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
                ::find((map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
                        *)in_stack_fffffffffffff918,(key_type *)0x27f42f);
    ppVar6 = std::_Rb_tree_iterator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>::
             operator->((_Rb_tree_iterator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_> *)
                        0x27f456);
    local_3f0 = ppVar6->second;
    std::queue<int,_std::deque<int,_std::allocator<int>_>_>::pop
              ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)0x27f46f);
    for (local_3f4 = 0; uVar4 = (ulong)local_3f4,
        sVar5 = std::
                vector<front::optim_mir::BasicBlock_*,_std::allocator<front::optim_mir::BasicBlock_*>_>
                ::size(&local_3f0->preBlock), uVar4 < sVar5; local_3f4 = local_3f4 + 1) {
      ppBVar9 = std::
                vector<front::optim_mir::BasicBlock_*,_std::allocator<front::optim_mir::BasicBlock_*>_>
                ::operator[](&local_3f0->preBlock,(long)local_3f4);
      local_400 = *ppBVar9;
      local_410 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                   ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff918);
      local_418 = (int *)std::vector<int,_std::allocator<int>_>::end
                                   ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff918);
      local_408 = (int *)std::
                         find<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
                                   (in_stack_fffffffffffff938,in_stack_fffffffffffff930,
                                    &in_stack_fffffffffffff928->first);
      local_420 = (int *)std::vector<int,_std::allocator<int>_>::end
                                   ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff918);
      bVar1 = __gnu_cxx::operator==
                        ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         in_stack_fffffffffffff920,
                         (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         in_stack_fffffffffffff918);
      if (bVar1) {
        local_428 = (_Base_ptr)
                    std::
                    map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                    ::find((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                            *)in_stack_fffffffffffff918,(key_type *)0x27f580);
        local_158._M_node = local_428;
        std::_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>::
        operator->((_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                    *)0x27f5b1);
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff970._M_node,
                   in_stack_fffffffffffff968);
        sVar5 = std::vector<int,_std::allocator<int>_>::size(&local_440);
        if (sVar5 != 0) {
          std::vector<int,_std::allocator<int>_>::operator[](&local_440,0);
          local_448 = (_Base_ptr)
                      std::
                      map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                      ::find((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                              *)in_stack_fffffffffffff918,(key_type *)0x27f5ff);
          local_158._M_node = local_448;
          std::_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>::
          operator->((_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                      *)0x27f630);
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff970._M_node,
                     in_stack_fffffffffffff968);
          for (local_464 = 1; uVar4 = (ulong)local_464,
              sVar5 = std::vector<int,_std::allocator<int>_>::size(&local_440), uVar4 < sVar5;
              local_464 = local_464 + 1) {
            std::vector<int,_std::allocator<int>_>::operator[](&local_440,(long)local_464);
            in_stack_fffffffffffff970 =
                 std::
                 map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                 ::find((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                         *)in_stack_fffffffffffff918,(key_type *)0x27f6a1);
            local_470 = in_stack_fffffffffffff970._M_node;
            local_158._M_node = in_stack_fffffffffffff970._M_node;
            std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff970._M_node,
                       in_stack_fffffffffffff968);
            std::_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>::
            operator->((_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                        *)0x27f6e9);
            std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff970._M_node,
                       in_stack_fffffffffffff968);
            vectors_set_union((vector<int,_std::allocator<int>_> *)
                              CONCAT17(uVar2,in_stack_fffffffffffff9b8),v2_00);
            std::vector<int,_std::allocator<int>_>::operator=
                      ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff930._M_current,
                       (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff928);
            std::vector<int,_std::allocator<int>_>::~vector
                      ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff930._M_current);
            std::vector<int,_std::allocator<int>_>::~vector
                      ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff930._M_current);
            std::vector<int,_std::allocator<int>_>::~vector
                      ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff930._M_current);
          }
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff970._M_node,
                     in_stack_fffffffffffff968);
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff970._M_node,
                     in_stack_fffffffffffff968);
          vectors_difference((vector<int,_std::allocator<int>_> *)
                             CONCAT17(uVar2,in_stack_fffffffffffff9b8),v2_00);
          std::vector<int,_std::allocator<int>_>::operator=
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff930._M_current,
                     (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff928);
          std::vector<int,_std::allocator<int>_>::~vector
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff930._M_current);
          std::vector<int,_std::allocator<int>_>::~vector
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff930._M_current);
          std::vector<int,_std::allocator<int>_>::~vector
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff930._M_current);
          std::vector<int,_std::allocator<int>_>::~vector
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff930._M_current);
        }
        in_stack_fffffffffffff968 =
             std::
             map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
             ::operator[](in_stack_fffffffffffff960,in_stack_fffffffffffff958);
        std::vector<int,_std::allocator<int>_>::operator=
                  (this,(vector<int,_std::allocator<int>_> *)
                        CONCAT17(uVar2,in_stack_fffffffffffff9b8));
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff930._M_current,
                   &in_stack_fffffffffffff928->first);
        std::queue<int,_std::deque<int,_std::allocator<int>_>_>::push
                  ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)in_stack_fffffffffffff920,
                   (value_type *)in_stack_fffffffffffff918);
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff930._M_current);
      }
    }
  }
  local_501 = 0;
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)0x27f987)
  ;
  local_510 = (_Base_ptr)
              std::
              map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
              ::begin((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                       *)in_stack_fffffffffffff918);
  local_158._M_node = local_510;
  while( true ) {
    local_518._M_node =
         (_Base_ptr)
         std::
         map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
         ::end((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                *)in_stack_fffffffffffff918);
    bVar1 = std::operator!=(&local_158,&local_518);
    if (!bVar1) break;
    ppVar7 = std::_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                           *)0x27f9ec);
    sVar5 = std::vector<int,_std::allocator<int>_>::size(&ppVar7->second);
    if (sVar5 != 0) {
      ppVar7 = std::
               _Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>::
               operator->((_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                           *)0x27fa14);
      ppVar10 = std::
                _Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>::
                operator->((_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                            *)0x27fa23);
      __y = std::vector<int,_std::allocator<int>_>::operator[](&ppVar10->second,0);
      std::pair<const_int,_int>::pair<int_&,_true>(&local_520,&ppVar7->first,__y);
      pVar14 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
               insert((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                      in_stack_fffffffffffff930._M_current,(value_type *)in_stack_fffffffffffff928);
      local_530 = (_Base_ptr)pVar14.first._M_node;
      local_528 = pVar14.second;
    }
    local_538 = (_Base_ptr)
                std::
                _Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>::
                operator++((_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                            *)in_stack_fffffffffffff928,
                           (int)((ulong)in_stack_fffffffffffff920 >> 0x20));
  }
  std::_Rb_tree_iterator<std::pair<const_int,_int>_>::_Rb_tree_iterator(&local_540);
  poVar11 = (ostream *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  poVar11 = std::operator<<(poVar11,"*** desplay idom ***");
  std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
  local_548 = (_Base_ptr)
              std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::begin
                        (in_stack_fffffffffffff918);
  local_540._M_node = local_548;
  while( true ) {
    local_550._M_node =
         (_Base_ptr)
         std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::end
                   (in_stack_fffffffffffff918);
    bVar1 = std::operator!=(&local_540,&local_550);
    if (!bVar1) break;
    ppVar12 = std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator->
                        ((_Rb_tree_iterator<std::pair<const_int,_int>_> *)0x27fb7f);
    in_stack_fffffffffffff930._M_current =
         (int *)std::ostream::operator<<(&std::cout,ppVar12->first);
    poVar11 = std::operator<<((ostream *)in_stack_fffffffffffff930._M_current," ");
    ppVar12 = std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator->
                        ((_Rb_tree_iterator<std::pair<const_int,_int>_> *)0x27fbb9);
    this_00 = (void *)std::ostream::operator<<(poVar11,ppVar12->second);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator++
              ((_Rb_tree_iterator<std::pair<const_int,_int>_> *)poVar11,
               (int)((ulong)this_00 >> 0x20));
  }
  local_501 = 1;
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff930._M_current);
  std::queue<int,_std::deque<int,_std::allocator<int>_>_>::~queue
            ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)0x27fc37);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff930._M_current);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff930._M_current);
  std::
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~map((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
          *)0x27fc5e);
  return in_RDI;
}

Assistant:

map<int, int> find_idom(map<int, BasicBlock*> nodes) {
  BasicBlock* exit = find_exit(nodes);

  // step1: Calculate the domin nodes of each block
  // rule: Dom(n) = {n} ∩ Dom(Pred(n))
  map<int, vector<int>> dom;

  // step1.1: initialize dom
  map<int, BasicBlock*>::iterator it;
  vector<int> N;
  for (int i = 0; i < order.size(); i++) {
    N.push_back(order[i]);
  }
  N.push_back(-2);
  N.push_back(-1);
  for (it = nodes.begin(); it != nodes.end(); it++) {
    if (it->first == -1) {
      vector<int> pre;
      pre.push_back(it->first);
      dom.insert(map<int, vector<int>>::value_type(it->first, pre));
    } else {
      dom.insert(map<int, vector<int>>::value_type(it->first, N));
    }
  }

  // step1.2: Loop until dom does not change
  bool flag = true;
  map<int, vector<int>>::iterator iter;
  while (flag) {
    flag = false;
    for (int i = 0; i < N.size(); i++) {
      it = nodes.find(N[i]);
      vector<int> temp;
      temp.push_back(N[i]);
      if (it->second->preBlock.size() > 0) {
        iter = dom.find(it->second->preBlock[0]->id);
        vector<int> v1 = iter->second;
        for (int j = 1; j < it->second->preBlock.size(); j++) {
          iter = dom.find(it->second->preBlock[j]->id);
          v1 = vectors_intersection(v1, iter->second);
        }
        temp = vectors_set_union(temp, v1);
      }
      iter = dom.find(N[i]);
      // the set size monotonically decreases, so if the set size is the same
      // the set contents are the same
      if (iter->second.size() != temp.size()) {
        dom[N[i]] = temp;
        flag = true;
      }
    }
  }
  /*cout << endl << "*** desplay dom ***" << endl;
  for (iter = dom.begin(); iter != dom.end(); iter++) {
      cout << iter->first;
      for (int i = 0; i < iter->second.size(); i++) {
          cout << " " << iter->second[i];
      }
      cout << endl;
  }*/

  // step2: Calculate the immediate domin nodes of each block
  // step2.1: delete node itself;
  for (iter = dom.begin(); iter != dom.end(); iter++) {
    iter->second.erase(
        remove(iter->second.begin(), iter->second.end(), iter->first),
        iter->second.end());
  }

  // step2.2: BFS
  vector<int> visit;
  queue<int> q;
  iter = dom.find(exit->id);
  vector<int> v1 = iter->second;
  if (v1.size() > 0) {
    iter = dom.find(v1[0]);
    vector<int> v2 = iter->second;
    for (int i = 1; i < v1.size(); i++) {
      iter = dom.find(v1[i]);
      v2 = vectors_set_union(v2, iter->second);
    }
    v1 = vectors_difference(v1, v2);
  }
  dom[exit->id] = v1;
  visit.push_back(exit->id);
  q.push(exit->id);
  while (!q.empty()) {
    map<int, BasicBlock*>::iterator itt = nodes.find(q.front());
    BasicBlock* p = itt->second;
    q.pop();
    for (int i = 0; i < p->preBlock.size(); i++) {
      BasicBlock* prep = p->preBlock[i];
      vector<int>::iterator itt = find(visit.begin(), visit.end(), prep->id);
      if (itt == visit.end()) {  // never visit
        iter = dom.find(prep->id);
        vector<int> v1 = iter->second;
        if (v1.size() > 0) {
          iter = dom.find(v1[0]);
          vector<int> v2 = iter->second;
          for (int i = 1; i < v1.size(); i++) {
            iter = dom.find(v1[i]);
            v2 = vectors_set_union(v2, iter->second);
          }
          v1 = vectors_difference(v1, v2);
        }
        dom[prep->id] = v1;
        visit.push_back(prep->id);
        q.push(prep->id);
      }
    }
  }
  /*for (iter = dom.begin(); iter != dom.end(); iter++) {
      cout << iter->first;
      for (int i = 0; i < iter->second.size(); i++) {
          cout << " " << iter->second[i];
      }
      cout << endl;
  }*/
  map<int, int> dom1;
  for (iter = dom.begin(); iter != dom.end(); iter++) {
    if (iter->second.size() > 0) {
      dom1.insert(map<int, int>::value_type(iter->first, iter->second[0]));
    }
  }
  map<int, int>::iterator i;
  cout << endl << "*** desplay idom ***" << endl;
  for (i = dom1.begin(); i != dom1.end(); i++) {
    cout << i->first << " " << i->second << endl;
  }
  return dom1;
}